

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::EventLoop::EventLoop(EventLoop *this)

{
  this->port = (EventPort *)&_::NullEventPort::instance;
  this->running = false;
  this->lastRunnableState = false;
  this->head = (Event *)0x0;
  this->tail = &this->head;
  this->depthFirstInsertPoint = &this->head;
  heap<kj::TaskSet,kj::_::LoggingErrorHandler&>
            ((kj *)&this->daemons,(LoggingErrorHandler *)&_::LoggingErrorHandler::instance);
  return;
}

Assistant:

EventLoop::EventLoop()
    : port(_::NullEventPort::instance),
      daemons(kj::heap<TaskSet>(_::LoggingErrorHandler::instance)) {}